

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void Centaurus::LDFARoutineEM64T<char>::emit_state
               (X86Assembler *as,Label *rejectlabel,LDFAState<char> *state,
               vector<asmjit::Label,_std::allocator<asmjit::Label>_> *labels,
               vector<asmjit::Label,_std::allocator<asmjit::Label>_> *exitlabels)

{
  CodeEmitter *this;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> *this_00;
  Label *pLVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *this_01;
  reference this_02;
  CharClass<char> *this_03;
  reference this_04;
  undefined4 in_stack_fffffffffffffd68;
  uint32_t in_stack_fffffffffffffd6c;
  CodeEmitter *in_stack_fffffffffffffd70;
  Label *in_stack_fffffffffffffd78;
  CodeEmitter *in_stack_fffffffffffffd80;
  Label *in_stack_fffffffffffffd88;
  Operand_ *in_stack_fffffffffffffd90;
  Label *in_stack_fffffffffffffd98;
  uint32_t instId;
  undefined4 in_stack_fffffffffffffda0;
  uint in_stack_fffffffffffffda4;
  Range<char> *r;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  CharClass<char> *__range3;
  NFATransition<char> *tr;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *__range2
  ;
  undefined4 local_1d8;
  undefined4 local_1d4;
  CodeEmitter *local_1d0;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> *exitlabels_local;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> *labels_local;
  LDFAState<char> *state_local;
  Label *rejectlabel_local;
  X86Assembler *as_local;
  undefined8 local_1a0;
  Label *local_198;
  undefined8 local_190;
  undefined8 local_188;
  Label *local_180;
  LDFAState<char> *local_178;
  Label *local_170;
  reference local_168;
  Label *local_160;
  reference local_158;
  Label *local_150;
  int local_144;
  undefined8 local_140;
  Label *local_138;
  uint local_12c;
  undefined8 local_128;
  Label *local_120;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  **local_118;
  undefined8 local_110;
  X86Assembler *local_108;
  undefined4 local_fc;
  undefined8 local_f8;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  **local_f0;
  undefined4 local_e8;
  undefined4 local_e4;
  uint32_t signature;
  undefined4 local_dc;
  undefined8 local_d8;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  **local_d0;
  undefined8 local_c8;
  Label *local_c0;
  uint local_b4;
  undefined8 local_b0;
  Operand_ *local_a8;
  reference local_a0;
  Label *local_98;
  reference local_90;
  Label *local_88;
  undefined1 *local_80;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  **local_78;
  undefined4 local_70;
  undefined4 local_6c;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  **local_50;
  undefined4 local_48;
  undefined4 local_44;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  **local_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 local_30;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_20;
  uint local_14;
  uint local_10;
  int local_c;
  
  local_f0 = &__range2;
  local_f8 = 0x2279c8;
  local_fc = 0;
  local_d0 = &__range2;
  local_d8 = 0x2279c8;
  local_dc = 0;
  signature = 1;
  local_e4 = 0;
  local_80 = &asmjit::NoInit;
  local_58 = &asmjit::NoInit;
  local_30 = 0x2279c8;
  local_20 = 0x2279c8;
  local_24 = 0x1f;
  local_28 = 3;
  local_e8 = 0x1000030;
  local_6c = 0x1000032;
  local_70 = 0;
  local_48 = 0;
  local_38 = 0;
  __range2 = (vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
              *)0x1000032;
  local_60 = 0x2279c8;
  local_1d4 = 3;
  local_1d8 = 0;
  local_110 = 0x227998;
  local_118 = &__range2;
  local_1d0 = (CodeEmitter *)exitlabels;
  exitlabels_local = labels;
  labels_local = (vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)state;
  state_local = (LDFAState<char> *)rejectlabel;
  rejectlabel_local = (Label *)as;
  local_108 = as;
  local_78 = local_d0;
  local_68 = local_d0;
  local_50 = local_d0;
  local_44 = local_6c;
  local_40 = local_d0;
  local_34 = local_6c;
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffd80,(uint32_t)((ulong)in_stack_fffffffffffffd78 >> 0x20),
             (Operand_ *)in_stack_fffffffffffffd70,
             (Operand_ *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  local_180 = rejectlabel_local;
  local_188 = 0x2279a8;
  local_190 = 0x227998;
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffd80,(uint32_t)((ulong)in_stack_fffffffffffffd78 >> 0x20),
             (Operand_ *)in_stack_fffffffffffffd70,
             (Operand_ *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  local_c0 = rejectlabel_local;
  local_c8 = 0x2279c8;
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,(Operand_ *)0x16e7ae);
  this_01 = LDFAState<char>::get_transitions((LDFAState<char> *)labels_local);
  __end0 = std::
           vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           ::begin(this_01);
  tr = (NFATransition<char> *)
       std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
       ::end(this_01);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                                     *)&tr), bVar2) {
    this_02 = __gnu_cxx::
              __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
              ::operator*(&__end0);
    this_03 = NFATransition<char>::label(this_02);
    __end0_1 = CharClass<char>::begin(this_03);
    r = (Range<char> *)CharClass<char>::end(this_03);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end0_1,
                              (__normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
                               *)&r), bVar2) {
      this_04 = __gnu_cxx::
                __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
                ::operator*(&__end0_1);
      bVar3 = Range<char>::start(this_04);
      bVar4 = Range<char>::end(this_04);
      pLVar1 = rejectlabel_local;
      instId = (uint32_t)((ulong)in_stack_fffffffffffffd98 >> 0x20);
      if (bVar3 + 1 == (uint)bVar4) {
        bVar3 = Range<char>::start(this_04);
        local_120 = pLVar1;
        local_128 = 0x227998;
        local_12c = (uint)bVar3;
        local_10 = local_12c;
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (uint32_t)((ulong)in_stack_fffffffffffffd98 >> 0x20),in_stack_fffffffffffffd90,
                   (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
        iVar5 = NFATransition<char>::dest(this_02);
        pLVar1 = rejectlabel_local;
        this_00 = exitlabels_local;
        this = local_1d0;
        if (iVar5 < 0) {
          iVar5 = NFATransition<char>::dest(this_02);
          local_168 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                                ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)this,
                                 (long)(-1 - iVar5));
          local_160 = pLVar1;
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,(Operand_ *)0x16ea03);
        }
        else {
          iVar5 = NFATransition<char>::dest(this_02);
          local_158 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                                (this_00,(long)iVar5);
          local_150 = pLVar1;
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,(Operand_ *)0x16e994);
        }
      }
      else {
        in_stack_fffffffffffffd90 = (Operand_ *)rejectlabel_local;
        bVar3 = Range<char>::start(this_04);
        local_b0 = 0x227998;
        local_b4 = (uint)bVar3;
        local_a8 = in_stack_fffffffffffffd90;
        local_14 = local_b4;
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   instId,in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20))
        ;
        in_stack_fffffffffffffd98 = rejectlabel_local;
        bVar3 = Range<char>::end(this_04);
        in_stack_fffffffffffffda4 = (uint)bVar3;
        bVar3 = Range<char>::start(this_04);
        local_144 = in_stack_fffffffffffffda4 - bVar3;
        local_140 = 0x227998;
        local_138 = in_stack_fffffffffffffd98;
        local_c = local_144;
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (uint32_t)((ulong)in_stack_fffffffffffffd98 >> 0x20),in_stack_fffffffffffffd90,
                   (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
        iVar5 = NFATransition<char>::dest(this_02);
        if (iVar5 < 0) {
          in_stack_fffffffffffffd70 = local_1d0;
          in_stack_fffffffffffffd78 = rejectlabel_local;
          iVar5 = NFATransition<char>::dest(this_02);
          local_a0 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                               ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)
                                in_stack_fffffffffffffd70,(long)(-1 - iVar5));
          local_98 = in_stack_fffffffffffffd78;
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,(Operand_ *)0x16ebd9);
        }
        else {
          in_stack_fffffffffffffd80 = (CodeEmitter *)exitlabels_local;
          in_stack_fffffffffffffd88 = rejectlabel_local;
          iVar5 = NFATransition<char>::dest(this_02);
          local_90 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                               ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)
                                in_stack_fffffffffffffd80,(long)iVar5);
          local_88 = in_stack_fffffffffffffd88;
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,(Operand_ *)0x16eb6a);
        }
        local_198 = rejectlabel_local;
        local_1a0 = 0x227998;
        as_local = (X86Assembler *)(asmjit::x86OpData + 0x490);
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffffd80,(uint32_t)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                   (Operand_ *)in_stack_fffffffffffffd70,
                   (Operand_ *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      }
      __gnu_cxx::
      __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
      ::operator++(&__end0_1);
    }
    __gnu_cxx::
    __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
    ::operator++(&__end0);
  }
  local_170 = rejectlabel_local;
  local_178 = state_local;
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,(Operand_ *)0x16ec88);
  return;
}

Assistant:

void LDFARoutineEM64T<TCHAR>::emit_state(asmjit::X86Assembler& as, asmjit::Label& rejectlabel, const LDFAState<TCHAR>& state, std::vector<asmjit::Label>& labels, std::vector<asmjit::Label>& exitlabels)
{
    if (sizeof(TCHAR) == 1)
        as.movzx(CHAR_REG, asmjit::x86::byte_ptr(PEEK_REG, 0));
    else
        as.movzx(CHAR_REG, asmjit::x86::word_ptr(PEEK_REG, 0));
    as.mov(CHAR2_REG, CHAR_REG);
    if (sizeof(TCHAR) == 1)
        as.inc(PEEK_REG);
    else
        as.add(PEEK_REG, 2);

    for (const auto& tr : state.get_transitions())
    {
        for (const auto& r : tr.label())
        {
            if (r.start() + 1 == r.end())
            {
                as.cmp(CHAR_REG, r.start());
                if (tr.dest() >= 0)
                {
                    as.je(labels[tr.dest()]);
                }
                else
                {
                    as.je(exitlabels[-tr.dest() - 1]);
                }
            }
            else
            {
                as.sub(CHAR_REG, r.start());
                as.cmp(CHAR_REG, r.end() - r.start());
                if (tr.dest() >= 0)
                {
                    as.jb(labels[tr.dest()]);
                }
                else
                {
                    as.jb(exitlabels[-tr.dest() - 1]);
                }
                as.mov(CHAR_REG, CHAR2_REG);
            }
        }
    }
    as.jmp(rejectlabel);
}